

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustach.c
# Opt level: O2

int fmustach(char *template,mustach_itf *itf,void *closure,FILE *file)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (itf->start != (_func_int_void_ptr *)0x0) {
    iVar2 = (*itf->start)(closure);
    if (iVar2 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return iVar2;
      }
      goto LAB_00104a9b;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar2 = process(template,itf,closure,file,"{{","}}");
    return iVar2;
  }
LAB_00104a9b:
  __stack_chk_fail();
}

Assistant:

int fmustach(const char *template, struct mustach_itf *itf, void *closure, FILE *file)
{
	int rc = itf->start ? itf->start(closure) : 0;
	if (rc == 0)
		rc = process(template, itf, closure, file, "{{", "}}");
	return rc;
}